

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw.cpp
# Opt level: O0

void anon_unknown.dwarf_12966::test_sync_send(void)

{
  uint uVar1;
  mutable_buffer local_198;
  undefined8 uStack_188;
  can_frame in_frame;
  mutable_buffer local_170;
  undefined4 local_15c;
  undefined8 uStack_158;
  uint8_t data [4];
  can_frame out_frame;
  string local_140;
  basic_endpoint<canary::raw> local_120;
  undefined1 local_108 [8];
  socket sock2;
  allocator<char> local_a1;
  string local_a0;
  basic_endpoint<canary::raw> local_80;
  undefined1 local_68 [8];
  socket sock1;
  io_context ctx;
  
  boost::asio::io_context::io_context
            ((io_context *)
             &sock1.
              super_basic_socket<canary::raw,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              .impl_.executor_.prop_fns_,1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"vcan0",&local_a1);
  uVar1 = canary::get_interface_index(&local_a0);
  canary::basic_endpoint<canary::raw>::basic_endpoint(&local_80,uVar1);
  boost::asio::
  basic_raw_socket<canary::raw,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_raw_socket<boost::asio::io_context>
            ((basic_raw_socket<canary::raw,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)local_68,
             (io_context *)
             &sock1.
              super_basic_socket<canary::raw,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              .impl_.executor_.prop_fns_,&local_80,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"vcan0",(allocator<char> *)(out_frame.data + 7));
  uVar1 = canary::get_interface_index(&local_140);
  canary::basic_endpoint<canary::raw>::basic_endpoint(&local_120,uVar1);
  boost::asio::
  basic_raw_socket<canary::raw,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_raw_socket<boost::asio::io_context>
            ((basic_raw_socket<canary::raw,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)local_108,
             (io_context *)
             &sock1.
              super_basic_socket<canary::raw,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              .impl_.executor_.prop_fns_,&local_120,(type *)0x0);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator((allocator<char> *)(out_frame.data + 7));
  local_15c = 0xefbeadde;
  uStack_158 = 0x4000000ff;
  out_frame.can_id = 0xefbeadde;
  out_frame.field_1 = (anon_union_1_2_9a79380a_for_can_frame_1)0x0;
  out_frame.__pad = '\0';
  out_frame.__res0 = '\0';
  out_frame.len8_dlc = '\0';
  local_170 = (mutable_buffer)boost::asio::buffer(&stack0xfffffffffffffea8,0x10);
  boost::asio::
  basic_raw_socket<canary::raw,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::send<boost::asio::mutable_buffers_1>
            ((basic_raw_socket<canary::raw,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)local_68,(mutable_buffers_1 *)&local_170);
  uStack_188 = 0;
  in_frame.can_id = 0;
  in_frame.field_1 = (anon_union_1_2_9a79380a_for_can_frame_1)0x0;
  in_frame.__pad = '\0';
  in_frame.__res0 = '\0';
  in_frame.len8_dlc = '\0';
  local_198 = (mutable_buffer)boost::asio::buffer(&uStack_188,0x10);
  boost::asio::
  basic_raw_socket<canary::raw,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::receive<boost::asio::mutable_buffers_1>
            ((basic_raw_socket<canary::raw,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)local_108,(mutable_buffers_1 *)&local_198);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_int,unsigned_int>
            ("in_frame.can_id","out_frame.can_id",
             "/workspace/llm4binary/github/license_c_cmakelists/djarek[P]canary/tests/raw.cpp",0x26,
             "void (anonymous namespace)::test_sync_send()",&uStack_188,&stack0xfffffffffffffea8);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,unsigned_char>
            ("in_frame.can_dlc","out_frame.can_dlc",
             "/workspace/llm4binary/github/license_c_cmakelists/djarek[P]canary/tests/raw.cpp",0x27,
             "void (anonymous namespace)::test_sync_send()",(long)&uStack_188 + 4,data);
  boost::detail::test_all_eq_impl<std::ostream,unsigned_char*,unsigned_char*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/djarek[P]canary/tests/raw.cpp",0x2b,
             "void (anonymous namespace)::test_sync_send()",(uchar *)&in_frame,&in_frame.field_1.len
             ,(uchar *)&out_frame,&out_frame.field_1.len);
  boost::asio::
  basic_raw_socket<canary::raw,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~basic_raw_socket((basic_raw_socket<canary::raw,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                       *)local_108);
  boost::asio::
  basic_raw_socket<canary::raw,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::~basic_raw_socket((basic_raw_socket<canary::raw,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                       *)local_68);
  boost::asio::io_context::~io_context
            ((io_context *)
             &sock1.
              super_basic_socket<canary::raw,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              .impl_.executor_.prop_fns_);
  return;
}

Assistant:

void
test_sync_send()
{
    net::io_context ctx{1};
    canary::raw::socket sock1{
      ctx, canary::raw::endpoint{canary::get_interface_index("vcan0")}};
    canary::raw::socket sock2{
      ctx, canary::raw::endpoint{canary::get_interface_index("vcan0")}};
    ::can_frame out_frame{};
    out_frame.can_id = 0xFF;
    std::uint8_t const data[] = {0xDE, 0xAD, 0xBE, 0xEF};
    out_frame.can_dlc = sizeof(data);
    std::memcpy(out_frame.data, data, sizeof(data));
    sock1.send(net::buffer(&out_frame, sizeof(out_frame)));
    ::can_frame in_frame{};
    sock2.receive(net::buffer(&in_frame, sizeof(in_frame)));

    BOOST_TEST_EQ(in_frame.can_id, out_frame.can_id);
    BOOST_TEST_EQ(in_frame.can_dlc, out_frame.can_dlc);
    BOOST_TEST_ALL_EQ(&in_frame.data[0],
                      &in_frame.data[sizeof(data)],
                      &out_frame.data[0],
                      &out_frame.data[sizeof(data)]);
}